

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

int get_entry_data_list(MMDB_s *mmdb,uint32_t offset,MMDB_entry_data_list_s *entry_data_list,
                       MMDB_data_pool_s *pool,int depth)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MMDB_entry_data_list_s *pMVar6;
  uint32_t uVar7;
  int iVar8;
  bool bVar9;
  
  if (0x1ff < depth) {
    return 7;
  }
  iVar3 = decode_one(mmdb,offset,&entry_data_list->entry_data);
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = depth + 1;
  uVar7 = (entry_data_list->entry_data).type;
  if (uVar7 == 0xb) {
    uVar7 = (entry_data_list->entry_data).offset_to_next;
    iVar8 = (entry_data_list->entry_data).data_size + 1;
    iVar4 = 0;
    do {
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        (entry_data_list->entry_data).offset_to_next = uVar7;
        break;
      }
      pMVar6 = data_pool_alloc(pool);
      if (pMVar6 == (MMDB_entry_data_list_s *)0x0) {
        bVar9 = false;
        iVar5 = 5;
      }
      else {
        iVar5 = get_entry_data_list(mmdb,uVar7,pMVar6,pool,iVar3);
        bVar9 = iVar5 == 0;
        if (bVar9) {
          uVar7 = (pMVar6->entry_data).offset_to_next;
          bVar9 = true;
          iVar5 = iVar4;
        }
      }
      iVar4 = iVar5;
    } while (bVar9);
LAB_00102f83:
    if (iVar8 == 0) {
      return 0;
    }
    return iVar4;
  }
  if (uVar7 == 7) {
    uVar7 = (entry_data_list->entry_data).offset_to_next;
    iVar8 = (entry_data_list->entry_data).data_size + 1;
    iVar4 = 0;
    do {
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        (entry_data_list->entry_data).offset_to_next = uVar7;
        break;
      }
      pMVar6 = data_pool_alloc(pool);
      if (pMVar6 == (MMDB_entry_data_list_s *)0x0) {
LAB_00102ee7:
        bVar9 = false;
        iVar4 = 5;
      }
      else {
        iVar5 = get_entry_data_list(mmdb,uVar7,pMVar6,pool,iVar3);
        if (iVar5 == 0) {
          uVar7 = (pMVar6->entry_data).offset_to_next;
          pMVar6 = data_pool_alloc(pool);
          if (pMVar6 == (MMDB_entry_data_list_s *)0x0) goto LAB_00102ee7;
          iVar5 = get_entry_data_list(mmdb,uVar7,pMVar6,pool,iVar3);
          if (iVar5 == 0) {
            uVar7 = (pMVar6->entry_data).offset_to_next;
            bVar9 = true;
          }
          else {
            bVar9 = false;
            iVar4 = iVar5;
          }
        }
        else {
          bVar9 = false;
          iVar4 = iVar5;
        }
      }
    } while (bVar9);
    goto LAB_00102f83;
  }
  if (uVar7 != 1) {
    return 0;
  }
  uVar7 = (entry_data_list->entry_data).field_1.pointer;
  uVar1 = (entry_data_list->entry_data).offset_to_next;
  iVar4 = decode_one(mmdb,uVar7,&entry_data_list->entry_data);
  if (iVar4 == 0) {
    uVar2 = (entry_data_list->entry_data).type;
    if (uVar2 == 1) {
      iVar4 = 7;
    }
    else if (((uVar2 != 0xb) && (uVar2 != 7)) ||
            (iVar4 = get_entry_data_list(mmdb,uVar7,entry_data_list,pool,iVar3), iVar4 == 0)) {
      (entry_data_list->entry_data).offset_to_next = uVar1;
      bVar9 = true;
      iVar4 = 0;
      goto LAB_00102e41;
    }
  }
  bVar9 = false;
LAB_00102e41:
  if (bVar9) {
    return 0;
  }
  return iVar4;
}

Assistant:

static int get_entry_data_list(const MMDB_s *const mmdb,
                               uint32_t offset,
                               MMDB_entry_data_list_s *const entry_data_list,
                               MMDB_data_pool_s *const pool,
                               int depth) {
    if (depth >= MAXIMUM_DATA_STRUCTURE_DEPTH) {
        DEBUG_MSG("reached the maximum data structure depth");
        return MMDB_INVALID_DATA_ERROR;
    }
    depth++;
    CHECKED_DECODE_ONE(mmdb, offset, &entry_data_list->entry_data);

    switch (entry_data_list->entry_data.type) {
        case MMDB_DATA_TYPE_POINTER: {
            uint32_t next_offset = entry_data_list->entry_data.offset_to_next;
            uint32_t last_offset;
            CHECKED_DECODE_ONE(mmdb,
                               last_offset =
                                   entry_data_list->entry_data.pointer,
                               &entry_data_list->entry_data);

            /* Pointers to pointers are illegal under the spec */
            if (entry_data_list->entry_data.type == MMDB_DATA_TYPE_POINTER) {
                DEBUG_MSG("pointer points to another pointer");
                return MMDB_INVALID_DATA_ERROR;
            }

            if (entry_data_list->entry_data.type == MMDB_DATA_TYPE_ARRAY ||
                entry_data_list->entry_data.type == MMDB_DATA_TYPE_MAP) {

                int status = get_entry_data_list(
                    mmdb, last_offset, entry_data_list, pool, depth);
                if (MMDB_SUCCESS != status) {
                    DEBUG_MSG("get_entry_data_list on pointer failed.");
                    return status;
                }
            }
            entry_data_list->entry_data.offset_to_next = next_offset;
        } break;
        case MMDB_DATA_TYPE_ARRAY: {
            uint32_t array_size = entry_data_list->entry_data.data_size;
            uint32_t array_offset = entry_data_list->entry_data.offset_to_next;
            while (array_size-- > 0) {
                MMDB_entry_data_list_s *entry_data_list_to =
                    data_pool_alloc(pool);
                if (!entry_data_list_to) {
                    return MMDB_OUT_OF_MEMORY_ERROR;
                }

                int status = get_entry_data_list(
                    mmdb, array_offset, entry_data_list_to, pool, depth);
                if (MMDB_SUCCESS != status) {
                    DEBUG_MSG("get_entry_data_list on array element failed.");
                    return status;
                }

                array_offset = entry_data_list_to->entry_data.offset_to_next;
            }
            entry_data_list->entry_data.offset_to_next = array_offset;

        } break;
        case MMDB_DATA_TYPE_MAP: {
            uint32_t size = entry_data_list->entry_data.data_size;

            offset = entry_data_list->entry_data.offset_to_next;
            while (size-- > 0) {
                MMDB_entry_data_list_s *list_key = data_pool_alloc(pool);
                if (!list_key) {
                    return MMDB_OUT_OF_MEMORY_ERROR;
                }

                int status =
                    get_entry_data_list(mmdb, offset, list_key, pool, depth);
                if (MMDB_SUCCESS != status) {
                    DEBUG_MSG("get_entry_data_list on map key failed.");
                    return status;
                }

                offset = list_key->entry_data.offset_to_next;

                MMDB_entry_data_list_s *list_value = data_pool_alloc(pool);
                if (!list_value) {
                    return MMDB_OUT_OF_MEMORY_ERROR;
                }

                status =
                    get_entry_data_list(mmdb, offset, list_value, pool, depth);
                if (MMDB_SUCCESS != status) {
                    DEBUG_MSG("get_entry_data_list on map element failed.");
                    return status;
                }
                offset = list_value->entry_data.offset_to_next;
            }
            entry_data_list->entry_data.offset_to_next = offset;
        } break;
        default:
            break;
    }

    return MMDB_SUCCESS;
}